

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,IfStmt *stmt)

{
  undefined1 *puVar1;
  StatementType SVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Var *var;
  element_type *peVar4;
  element_type *peVar5;
  undefined8 uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  element_type *peVar7;
  ostream *poVar8;
  uint32_t uVar9;
  pointer psVar10;
  pointer psVar11;
  string_view sVar12;
  string local_58;
  ostream *local_38;
  
  if (this->generator_->debug != true) goto LAB_001fed6a;
  uVar9 = *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  (stmt->super_Stmt).super_IRNode.verilog_ln = uVar9;
  peVar7 = (stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if ((peVar7->super_IRNode).verilog_ln != 0) goto LAB_001fed6a;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
    uVar9 = (peVar7->super_IRNode).verilog_ln;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (uVar9 != 0) goto LAB_001fed6a;
    uVar9 = *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
    peVar7 = (stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
      (peVar7->super_IRNode).verilog_ln = uVar9;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      goto LAB_001fed6a;
    }
  }
  (peVar7->super_IRNode).verilog_ln = uVar9;
LAB_001fed6a:
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  sVar12 = indent(this);
  local_38 = (ostream *)puVar1;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar12._M_str,sVar12._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if (",4);
  var = (stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  Stream::var_str_abi_cxx11_(&local_58,&this->stream_,var);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  (**this->_vptr_SystemVerilogCodeGen)
            (this,(stmt->then_body_).
                  super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar4 = (stmt->else_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar10 = (peVar4->super_StmtBlock).stmts_.
            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar11 = (peVar4->super_StmtBlock).stmts_.
            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar10 != psVar11) {
    peVar5 = (psVar10->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var3 = (psVar10->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
        peVar4 = (stmt->else_body_).
                 super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        psVar10 = (peVar4->super_StmtBlock).stmts_.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar11 = (peVar4->super_StmtBlock).stmts_.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if ((((long)psVar11 - (long)psVar10 == 0x10) && (SVar2 = peVar5->type_, SVar2 < Break)) &&
       ((0x109U >> (SVar2 & 0x1f) & 1) != 0)) {
      sVar12 = indent(this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_38,sVar12._M_str,sVar12._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"else ",5);
      this->skip_indent_ = true;
      peVar4 = (stmt->else_body_).
               super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (peVar4->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln =
           *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
      psVar10 = (peVar4->super_StmtBlock).stmts_.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (psVar10->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00._M_pi =
           (psVar10->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
      ;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        }
      }
      (**this->_vptr_SystemVerilogCodeGen)(this,uVar6);
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
    }
    else {
      sVar12 = indent(this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_38,sVar12._M_str,sVar12._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"else ",5);
      (**this->_vptr_SystemVerilogCodeGen)
                (this,(stmt->else_body_).
                      super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(IfStmt* stmt) {
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
        if (stmt->predicate()->verilog_ln == 0) stmt->predicate()->verilog_ln = stream_.line_no();
    }
    stream_ << indent() << "if (" << stream_.var_str(stmt->predicate()) << ") ";
    auto const& then_body = stmt->then_body();
    dispatch_node(then_body.get());

    auto const& else_body = stmt->else_body();
    if (!else_body->empty()) {
        // special case where there is another (and only) if statement nested inside the else body
        // i.e. the else if case
        auto first_stmt = else_body->empty() ? nullptr : else_body->get_stmt(0);
        bool skip = else_body->size() == 1 && (first_stmt->type() == StatementType::Assign ||
                                               first_stmt->type() == StatementType::If ||
                                               first_stmt->type() == StatementType::Return);
        if (skip) {
            stream_ << indent() << "else ";
            skip_indent_ = true;
            else_body->verilog_ln = stream_.line_no();
            dispatch_node((*else_body)[0].get());
        } else {
            stream_ << indent() << "else ";
            dispatch_node(stmt->else_body().get());
        }
    }
}